

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::UpdateMouseMovingWindowNewFrame(void)

{
  ImGuiID *pIVar1;
  float fVar2;
  ImGuiID IVar3;
  ImGuiWindow *window;
  ImGuiContext *pIVar4;
  ImGuiContext *g;
  ImGuiWindow *window_00;
  float fVar5;
  float fVar6;
  ImVec2 pos;
  ImVec2 local_10;
  
  pIVar4 = GImGui;
  window_00 = GImGui->MovingWindow;
  if (window_00 == (ImGuiWindow *)0x0) {
    if (GImGui->ActiveIdWindow == (ImGuiWindow *)0x0) {
      return;
    }
    IVar3 = GImGui->ActiveIdWindow->MoveId;
    if (IVar3 != GImGui->ActiveId) {
      return;
    }
    GImGui->ActiveIdIsAlive = IVar3;
    if (pIVar4->ActiveIdPreviousFrame == IVar3) {
      pIVar4->ActiveIdPreviousFrameIsAlive = true;
    }
    if ((pIVar4->IO).MouseDown[0] != false) {
      return;
    }
    pIVar4->ActiveIdIsJustActivated = IVar3 != 0;
    if (IVar3 != 0) {
      pIVar4->ActiveIdTimer = 0.0;
      pIVar4->ActiveIdHasBeenEdited = false;
      pIVar4->ActiveId = 0;
    }
    pIVar4->ActiveIdAllowNavDirFlags = 0;
    pIVar4->ActiveIdAllowOverlap = false;
    pIVar4->ActiveIdWindow = (ImGuiWindow *)0x0;
    return;
  }
  IVar3 = GImGui->ActiveId;
  pIVar1 = &GImGui->ActiveIdPreviousFrame;
  GImGui->ActiveIdIsAlive = IVar3;
  if (*pIVar1 == IVar3) {
    pIVar4->ActiveIdPreviousFrameIsAlive = true;
  }
  if ((((pIVar4->IO).MouseDown[0] != true) || (fVar5 = (pIVar4->IO).MousePos.x, fVar5 < -256000.0))
     || (fVar6 = (pIVar4->IO).MousePos.y, fVar6 < -256000.0)) {
    pIVar4->ActiveIdIsJustActivated = IVar3 != 0;
    if (IVar3 != 0) {
      pIVar4->ActiveIdTimer = 0.0;
      pIVar4->ActiveIdHasBeenEdited = false;
      pIVar4->ActiveId = 0;
    }
    pIVar4->ActiveIdAllowNavDirFlags = 0;
    pIVar4->ActiveIdAllowOverlap = false;
    pIVar4->ActiveIdWindow = (ImGuiWindow *)0x0;
    pIVar4->MovingWindow = (ImGuiWindow *)0x0;
    return;
  }
  window = window_00->RootWindow;
  fVar5 = fVar5 - (pIVar4->ActiveIdClickOffset).x;
  fVar6 = fVar6 - (pIVar4->ActiveIdClickOffset).y;
  local_10.y = fVar6;
  local_10.x = fVar5;
  fVar2 = (window->Pos).x;
  if ((fVar2 == fVar5) && (!NAN(fVar2) && !NAN(fVar5))) {
    fVar5 = (window->Pos).y;
    if ((fVar5 == fVar6) && (!NAN(fVar5) && !NAN(fVar6))) goto LAB_00121541;
  }
  if (((window->Flags & 0x100) == 0) && (pIVar4->SettingsDirtyTimer <= 0.0)) {
    pIVar4->SettingsDirtyTimer = (pIVar4->IO).IniSavingRate;
  }
  ::SetWindowPos(window,&local_10,1);
  window_00 = pIVar4->MovingWindow;
LAB_00121541:
  FocusWindow(window_00);
  return;
}

Assistant:

void ImGui::UpdateMouseMovingWindowNewFrame()
{
    ImGuiContext& g = *GImGui;
    if (g.MovingWindow != NULL)
    {
        // We actually want to move the root window. g.MovingWindow == window we clicked on (could be a child window).
        // We track it to preserve Focus and so that generally ActiveIdWindow == MovingWindow and ActiveId == MovingWindow->MoveId for consistency.
        KeepAliveID(g.ActiveId);
        IM_ASSERT(g.MovingWindow && g.MovingWindow->RootWindow);
        ImGuiWindow* moving_window = g.MovingWindow->RootWindow;
        if (g.IO.MouseDown[0] && IsMousePosValid(&g.IO.MousePos))
        {
            ImVec2 pos = g.IO.MousePos - g.ActiveIdClickOffset;
            if (moving_window->Pos.x != pos.x || moving_window->Pos.y != pos.y)
            {
                MarkIniSettingsDirty(moving_window);
                SetWindowPos(moving_window, pos, ImGuiCond_Always);
            }
            FocusWindow(g.MovingWindow);
        }
        else
        {
            ClearActiveID();
            g.MovingWindow = NULL;
        }
    }
    else
    {
        // When clicking/dragging from a window that has the _NoMove flag, we still set the ActiveId in order to prevent hovering others.
        if (g.ActiveIdWindow && g.ActiveIdWindow->MoveId == g.ActiveId)
        {
            KeepAliveID(g.ActiveId);
            if (!g.IO.MouseDown[0])
                ClearActiveID();
        }
    }
}